

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::ZConstraintForceModifier::doHarmonic(ZConstraintForceModifier *this)

{
  bool bVar1;
  pointer pZVar2;
  iterator this_00;
  iterator i_00;
  reference ppMVar3;
  double *pdVar4;
  ZConstraintForceModifier *in_RDI;
  iterator j;
  RealType rp;
  RealType harmonicF;
  RealType diff;
  Vector3d d;
  RealType resPos;
  Vector3d com_1;
  RealType pe;
  Molecule *mol;
  IntegrableObjectIterator ii;
  StuntDouble *sd;
  iterator i;
  RealType restPot;
  Vector3d com;
  Vector3d force;
  RealType totalFZ;
  Vector<double,_3U> *in_stack_fffffffffffffea8;
  Snapshot *in_stack_fffffffffffffeb0;
  Molecule *in_stack_fffffffffffffeb8;
  Molecule *in_stack_fffffffffffffec8;
  Molecule *in_stack_fffffffffffffed0;
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  local_128;
  RealType local_120;
  double local_118;
  double local_110;
  Molecule *in_stack_ffffffffffffff08;
  Vector3d *in_stack_ffffffffffffff28;
  Snapshot *in_stack_ffffffffffffff30;
  _Self local_a0;
  _List_node_base *local_98;
  RealType local_90;
  Molecule *local_88;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_80;
  StuntDouble *local_78;
  _List_iterator<OpenMD::ZconstraintMol> local_70;
  double local_68;
  double local_48;
  Vector<double,_3U> local_40;
  Vector<double,_3U> local_28;
  double local_10;
  
  local_10 = 0.0;
  local_48 = 0.0;
  Vector<double,_3U>::Vector(&local_40,&local_48);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Vector3<double>::Vector3((Vector3<double> *)0x1dda1b);
  local_68 = 0.0;
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator(&local_70);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_80);
  local_90 = Snapshot::getPotentialEnergy(in_stack_fffffffffffffeb0);
  Snapshot::setRawPotential(in_RDI->currSnapshot_,local_90);
  local_98 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffea8);
  local_70._M_node = local_98;
  while( true ) {
    local_a0._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffea8);
    bVar1 = std::operator!=(&local_70,&local_a0);
    if (!bVar1) break;
    pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x1ddadc);
    local_88 = pZVar2->mol;
    Molecule::getCom(in_stack_ffffffffffffff08);
    if ((in_RDI->usingSMD_ & 1U) == 0) {
      pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_iterator<OpenMD::ZconstraintMol> *)0x1ddb31);
      in_stack_fffffffffffffeb8 = (Molecule *)(pZVar2->param).zTargetPos;
    }
    else {
      pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_iterator<OpenMD::ZconstraintMol> *)0x1ddb17);
      in_stack_fffffffffffffeb8 = (Molecule *)pZVar2->cantPos;
    }
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(double)in_stack_fffffffffffffeb8,
               (double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffeb8,
                      (Vector<double,_3U> *)in_stack_fffffffffffffeb0);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8)
    ;
    Snapshot::wrapVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffff28,2);
    local_110 = *pdVar4;
    pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x1ddbcf);
    local_68 = (pZVar2->param).kz * 0.5 * local_110 * local_110 + local_68;
    pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x1ddc0f);
    local_118 = -((pZVar2->param).kz * local_110);
    local_10 = local_118 + local_10;
    local_78 = Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffed0,(iterator *)in_stack_fffffffffffffec8);
    while (local_78 != (StuntDouble *)0x0) {
      in_stack_fffffffffffffeb0 =
           (Snapshot *)
           getHFOfFixedZMols((ZConstraintForceModifier *)in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,(StuntDouble *)in_RDI,
                             (RealType)in_stack_fffffffffffffeb8);
      pdVar4 = Vector<double,_3U>::operator[](&local_28,2);
      *pdVar4 = (double)in_stack_fffffffffffffeb0;
      StuntDouble::addFrc((StuntDouble *)in_RDI,(Vector3d *)in_stack_fffffffffffffeb8);
      local_78 = Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffed0,(iterator *)in_stack_fffffffffffffec8);
    }
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_70);
  }
  local_120 = Snapshot::getRestraintPotential(in_RDI->currSnapshot_);
  Snapshot::setRestraintPotential(in_RDI->currSnapshot_,local_120 + local_68);
  Snapshot::setPotentialEnergy(in_RDI->currSnapshot_,local_90 + local_68);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  ::__normal_iterator(&local_128);
  this_00 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::begin
                      ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                       in_stack_fffffffffffffea8);
  local_128._M_current = this_00._M_current;
  while( true ) {
    i_00 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::end
                     ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                      in_stack_fffffffffffffea8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
              ::operator*(&local_128);
    local_88 = *ppMVar3;
    in_stack_fffffffffffffea8 =
         (Vector<double,_3U> *)
         getHFOfUnconsMols(in_RDI,in_stack_fffffffffffffeb8,(RealType)in_stack_fffffffffffffeb0);
    pdVar4 = Vector<double,_3U>::operator[](&local_28,2);
    *pdVar4 = (double)in_stack_fffffffffffffea8;
    local_78 = Molecule::beginIntegrableObject
                         ((Molecule *)this_00._M_current,(iterator *)i_00._M_current);
    while (local_78 != (StuntDouble *)0x0) {
      StuntDouble::addFrc((StuntDouble *)in_RDI,(Vector3d *)in_stack_fffffffffffffeb8);
      local_78 = Molecule::nextIntegrableObject
                           ((Molecule *)this_00._M_current,(iterator *)i_00._M_current);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator++(&local_128);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doHarmonic() {
    RealType totalFZ(0.0);
    Vector3d force(0.0);
    Vector3d com;
    RealType restPot(0.0);
    std::list<ZconstraintMol>::iterator i;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;
    Molecule* mol;

    RealType pe = currSnapshot_->getPotentialEnergy();
    currSnapshot_->setRawPotential(pe);

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol             = i->mol;
      Vector3d com    = mol->getCom();
      RealType resPos = usingSMD_ ? i->cantPos : i->param.zTargetPos;
      Vector3d d      = com - Vector3d(0.0, 0.0, resPos);
      currSnapshot_->wrapVector(d);

      RealType diff = d[whichDirection];

      restPot += 0.5 * i->param.kz * diff * diff;

      RealType harmonicF = -(i->param.kz * diff);
      totalFZ += harmonicF;

      // adjust force
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        force[whichDirection] = getHFOfFixedZMols(mol, sd, harmonicF);
        sd->addFrc(force);
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType rp = currSnapshot_->getRestraintPotential();
    currSnapshot_->setRestraintPotential(rp + restPot);

    currSnapshot_->setPotentialEnergy(pe + restPot);

    // modify the forces of unconstrained molecules
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol                   = *j;
      force[whichDirection] = getHFOfUnconsMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }